

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O2

bool google::protobuf::compiler::cpp::anon_unknown_57::CompareSortKeys<google::protobuf::Descriptor>
               (Descriptor *a,Descriptor *b)

{
  bool bVar1;
  string sStack_58;
  string local_38;
  
  GetSortKey<google::protobuf::Descriptor>(&sStack_58,a);
  GetSortKey<google::protobuf::Descriptor>(&local_38,b);
  bVar1 = std::operator<(&sStack_58,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&sStack_58);
  return bVar1;
}

Assistant:

bool CompareSortKeys(const T* a, const T* b) {
  return GetSortKey(*a) < GetSortKey(*b);
}